

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationZ.hpp
# Opt level: O1

RotationZ<std::complex<float>_> * __thiscall
qclab::qgates::RotationZ<std::complex<float>_>::operator/=
          (RotationZ<std::complex<float>_> *this,RotationZ<std::complex<float>_> *rhs)

{
  float fVar1;
  float fVar2;
  angle_type aVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  
  iVar4 = (*(this->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[3])();
  iVar5 = (*(rhs->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[3])(rhs);
  if (iVar4 == iVar5) {
    aVar3 = (this->super_QRotationGate1<std::complex<float>_>).rotation_.angle_;
    fVar6 = aVar3.cos_;
    fVar7 = aVar3.sin_;
    fVar1 = (rhs->super_QRotationGate1<std::complex<float>_>).rotation_.angle_.cos_;
    fVar2 = (rhs->super_QRotationGate1<std::complex<float>_>).rotation_.angle_.sin_;
    (this->super_QRotationGate1<std::complex<float>_>).rotation_.angle_.cos_ =
         fVar6 * fVar1 + fVar7 * fVar2;
    (this->super_QRotationGate1<std::complex<float>_>).rotation_.angle_.sin_ =
         fVar7 * fVar1 - fVar2 * fVar6;
    return this;
  }
  __assert_fail("this->qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationZ.hpp"
                ,0xaa,
                "RotationZ<T> &qclab::qgates::RotationZ<std::complex<float>>::operator/=(const RotationZ<T> &) [T = std::complex<float>]"
               );
}

Assistant:

inline RotationZ< T >& operator/=( const RotationZ< T >& rhs ) {
          assert( this->qubit() == rhs.qubit() ) ;
          this->rotation_ /= rhs.rotation() ;
          return *this ;
        }